

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O0

int run_test_udp_options6(void)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in6 addr;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    addr.sin6_addr.__in6_u.__u6_addr32[3] = 7;
  }
  else {
    iVar1 = uv_ip6_addr("::",0x23a3,&eval_a);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
              ,0x6d,"uv_ip6_addr(\"::\", 9123, &addr)","==","0",(long)iVar1,"==",0);
      abort();
    }
    addr.sin6_addr.__in6_u.__u6_addr32[3] = udp_options_test((sockaddr *)&eval_a);
  }
  return addr.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}